

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int __thiscall Board::place(Board *this,Block *block)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  
  lVar4 = (long)block->t;
  lVar5 = (long)block->o;
  for (lVar8 = 0; lVar6 = (long)block->x, lVar8 != 4; lVar8 = lVar8 + 1) {
    lVar6 = blockShape[lVar4][lVar5][lVar8 * 2] + lVar6;
    lVar7 = (long)*(int *)(lVar5 * 0x20 + lVar4 * 0x80 + 0x11ed44 + lVar8 * 8) + (long)block->y;
    this->rows[lVar6] = this->rows[lVar6] | 1 << ((byte)lVar7 & 0x1f);
    this->cols[lVar7] = this->cols[lVar7] | 1 << ((byte)lVar6 & 0x1f);
  }
  lVar8 = 0;
  iVar3 = 0;
  do {
    if (lVar8 == 4) {
      return iVar3;
    }
    lVar7 = (long)blockShape[lVar4][lVar5][lVar8 * 2];
    uVar10 = 1;
    if (this->rows[lVar7 + lVar6] != 0xfff) {
      lVar7 = lVar7 + lVar6 + -1;
      lVar2 = lVar7 << 0x20;
      do {
        lVar9 = lVar2;
        if (lVar7 == 0) break;
        piVar1 = this->rows + lVar7;
        lVar2 = lVar9 + -0x100000000;
        lVar7 = lVar7 + -1;
      } while (*piVar1 == 0xfff);
      uVar10 = (uint)((*(uint *)((long)this->rows + (lVar9 >> 0x1e)) >>
                       (blockShape[lVar4][lVar5][lVar8 * 2 + 1] + block->y & 0x1fU) & 1) != 0);
    }
    iVar3 = iVar3 + uVar10;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int Board::place(const Block &block){
    int i, tmpX, tmpY;
    auto shape = blockShape[block.t][block.o];
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        rows[tmpX] |= 1 << tmpY;
        cols[tmpY] |= 1 << tmpX;
    }
    int basenum =0;
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        bool base = rows[tmpX] == FULL_ROW;
        if (!base)
        {
            int t = tmpX - 1;
            while (t && rows[t] == FULL_ROW)
                --t;
            base = ((rows[t]>>tmpY)&1);
        }
        if (base)
            ++basenum;
    }
    return basenum;
}